

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lest_cpp03.hpp
# Opt level: O0

tests * lest::make_tests<lest::test[1]>(tests *__return_storage_ptr__,test (*c) [1])

{
  test *first;
  test *last;
  test (*c_local) [1];
  
  first = test_begin<lest::test[1]>(c);
  last = test_end<lest::test[1]>(c);
  make_tests(__return_storage_ptr__,first,last);
  return __return_storage_ptr__;
}

Assistant:

texts make_texts( C const & c ) { return make_texts( text_begin( c ), text_end( c ) ); }